

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,int bigendianp,int word,int sgned,
                   int *bitstream,_func_void_float_ptr_ptr_long_long_void_ptr *filter,
                   void *filter_param)

{
  vorbis_dsp_state *v;
  float *pfVar1;
  int iVar2;
  vorbis_info *pvVar3;
  ulong uVar4;
  long lVar5;
  int extraout_EDX;
  ulong uVar6;
  ulong extraout_RDX;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  short *psVar11;
  long lVar12;
  long lVar13;
  float **local_50;
  long local_48;
  int local_3c;
  vorbis_dsp_state *local_38;
  
  uVar6 = (ulong)(uint)length;
  uVar4 = (ulong)(uint)bigendianp;
  iVar2 = vf->ready_state;
  lVar13 = -0x83;
  if (0 < word && 1 < iVar2) {
    local_48 = CONCAT44(local_48._4_4_,length);
    v = &vf->vd;
    local_3c = bigendianp;
    while( true ) {
      iVar9 = (int)uVar6;
      if ((iVar2 == 4) &&
         (iVar2 = vorbis_synthesis_pcmout(v,&local_50), iVar9 = extraout_EDX, iVar2 != 0)) {
        lVar13 = (long)iVar2;
        if (iVar2 < 1) {
          return lVar13;
        }
        if (vf->seekable == 0) {
          pvVar3 = vf->vi;
        }
        else {
          pvVar3 = vf->vi;
          if (2 < vf->ready_state) {
            pvVar3 = pvVar3 + vf->current_link;
          }
        }
        lVar12 = (long)pvVar3->channels;
        if (pvVar3->channels - 0x100U < 0xffffff01) {
          return -0x83;
        }
        lVar5 = (ulong)(uint)word * lVar12;
        if ((long)(int)local_48 / lVar5 < lVar13) {
          lVar13 = (long)(int)local_48 / lVar5;
        }
        if (lVar13 < 1) {
          return -0x83;
        }
        local_48 = lVar5;
        local_38 = v;
        if (filter != (_func_void_float_ptr_ptr_long_long_void_ptr *)0x0) {
          (*filter)(local_50,lVar12,lVar13,filter_param);
        }
        if (word == 1) {
          lVar5 = 0;
          do {
            lVar7 = 0;
            do {
              iVar2 = (int)ROUND(local_50[lVar7][lVar5] * 128.0);
              if (iVar2 < -0x7f) {
                iVar2 = -0x80;
              }
              if (0x7e < iVar2) {
                iVar2 = 0x7f;
              }
              buffer[lVar7] = (char)iVar2 + (sgned == 0) * -0x80;
              lVar7 = lVar7 + 1;
            } while (lVar12 != lVar7);
            lVar5 = lVar5 + 1;
            buffer = buffer + lVar7;
          } while (lVar5 != lVar13);
        }
        else {
          iVar2 = (uint)(sgned == 0) * 0x8000;
          if (local_3c == 0) {
            if (sgned == 0) {
              lVar5 = 0;
              do {
                pfVar1 = local_50[lVar5];
                lVar7 = 0;
                psVar11 = (short *)buffer;
                do {
                  iVar9 = (int)ROUND(pfVar1[lVar7] * 32768.0);
                  if (iVar9 < -0x7fff) {
                    iVar9 = -0x8000;
                  }
                  if (0x7ffe < iVar9) {
                    iVar9 = 0x7fff;
                  }
                  *psVar11 = (short)iVar9 + (short)iVar2;
                  lVar7 = lVar7 + 1;
                  psVar11 = psVar11 + lVar12;
                } while (lVar13 != lVar7);
                lVar5 = lVar5 + 1;
                buffer = (char *)((long)buffer + 2);
              } while (lVar5 != lVar12);
            }
            else {
              lVar5 = 0;
              do {
                pfVar1 = local_50[lVar5];
                lVar7 = 0;
                pcVar10 = buffer;
                do {
                  iVar2 = (int)ROUND(pfVar1[lVar7] * 32768.0);
                  if (iVar2 < -0x7fff) {
                    iVar2 = -0x8000;
                  }
                  if (0x7ffe < iVar2) {
                    iVar2 = 0x7fff;
                  }
                  *(short *)pcVar10 = (short)iVar2;
                  lVar7 = lVar7 + 1;
                  pcVar10 = pcVar10 + lVar12 * 2;
                } while (lVar13 != lVar7);
                lVar5 = lVar5 + 1;
                buffer = buffer + 2;
              } while (lVar5 != lVar12);
            }
          }
          else {
            lVar5 = 0;
            do {
              lVar7 = 0;
              lVar8 = 0;
              do {
                iVar9 = (int)ROUND(local_50[lVar8][lVar5] * 32768.0);
                if (iVar9 < -0x7fff) {
                  iVar9 = -0x8000;
                }
                if (0x7ffe < iVar9) {
                  iVar9 = 0x7fff;
                }
                buffer[lVar8 * 2] = (char)((uint)(iVar9 + iVar2) >> 8);
                buffer[lVar8 * 2 + 1] = (char)iVar9;
                lVar8 = lVar8 + 1;
                lVar7 = lVar7 + -2;
              } while (lVar12 != lVar8);
              lVar5 = lVar5 + 1;
              buffer = buffer + -lVar7;
            } while (lVar5 != lVar13);
          }
        }
        vorbis_synthesis_read(local_38,(int)lVar13);
        iVar2 = vorbis_synthesis_halfrate_p(vf->vi);
        vf->pcm_offset = vf->pcm_offset + (lVar13 << ((byte)iVar2 & 0x3f));
        if (bitstream != (int *)0x0) {
          *bitstream = vf->current_link;
        }
        return lVar13 * local_48;
      }
      iVar2 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,iVar9,(int)uVar4);
      if (iVar2 == -2) {
        return 0;
      }
      if (iVar2 < 1) break;
      iVar2 = vf->ready_state;
      uVar6 = extraout_RDX;
    }
    lVar13 = (long)iVar2;
  }
  return lVar13;
}

Assistant:

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,
                    int bigendianp,int word,int sgned,int *bitstream,
                    void (*filter)(float **pcm,long channels,long samples,void *filter_param),void *filter_param){
  int i,j;
  int host_endian = host_is_big_endian();
  int hs;

  float **pcm;
  long samples;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(word<=0)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples)break;
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)
        return(0);
      if(ret<=0)
        return(ret);
    }

  }

  if(samples>0){

    /* yay! proceed to pack data into the byte buffer */

    long channels=ov_info(vf,-1)->channels;
    long bytespersample=word * channels;
    vorbis_fpu_control fpu;

    if(channels<1||channels>255)return(OV_EINVAL);
    if(samples>length/bytespersample)samples=length/bytespersample;

    if(samples <= 0)
      return OV_EINVAL;

    /* Here. */
    if(filter)
      filter(pcm,channels,samples,filter_param);

    /* a tight loop to pack each size */
    {
      int val;
      if(word==1){
        int off=(sgned?0:128);
        vorbis_fpu_setround(&fpu);
        for(j=0;j<samples;j++)
          for(i=0;i<channels;i++){
            val=vorbis_ftoi(pcm[i][j]*128.f);
            if(val>127)val=127;
            else if(val<-128)val=-128;
            *buffer++=val+off;
          }
        vorbis_fpu_restore(fpu);
      }else{
        int off=(sgned?0:32768);

        if(host_endian==bigendianp){
          if(sgned){

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) { /* It's faster in this order */
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }else{

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) {
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val+off;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }
        }else if(bigendianp){

          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val>>8);
              *buffer++=(val&0xff);
            }
          vorbis_fpu_restore(fpu);

        }else{
          int val;
          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val&0xff);
              *buffer++=(val>>8);
                  }
          vorbis_fpu_restore(fpu);

        }
      }
    }

    vorbis_synthesis_read(&vf->vd,samples);
    hs=vorbis_synthesis_halfrate_p(vf->vi);
    vf->pcm_offset+=(samples<<hs);
    if(bitstream)*bitstream=vf->current_link;
    return(samples*bytespersample);
  }else{
    return(samples);
  }
}